

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Writer.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::BP4Writer::BP4Writer(BP4Writer *this,IO *io,string *name,Mode mode,Comm *comm)

{
  int iVar1;
  LogMode mode_00;
  int priority;
  int verbosity;
  undefined8 *in_RDI;
  ScopedTimer __var235;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  TransportMan *in_stack_fffffffffffffe10;
  void *in_stack_fffffffffffffe50;
  Comm *in_stack_fffffffffffffe58;
  string *message;
  undefined8 in_stack_fffffffffffffe60;
  Mode openMode;
  string *activity;
  string *in_stack_fffffffffffffe68;
  string *source;
  IO *in_stack_fffffffffffffe70;
  string *component;
  string *in_stack_fffffffffffffe78;
  Engine *in_stack_fffffffffffffe80;
  allocator *value;
  string *in_stack_fffffffffffffef0;
  Params *in_stack_fffffffffffffef8;
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [71];
  allocator local_49;
  string local_48 [72];
  
  openMode = (Mode)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  value = &local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"BP4Writer",value);
  helper::Comm::Comm((Comm *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     (Comm *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  Engine::Engine(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                 in_stack_fffffffffffffe68,openMode,in_stack_fffffffffffffe58);
  helper::Comm::~Comm((Comm *)0xa2f672);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  *in_RDI = &PTR__BP4Writer_0112ea68;
  adios2::format::BP4Serializer::BP4Serializer
            ((BP4Serializer *)in_stack_fffffffffffffe10,
             (Comm *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  transportman::TransportMan::TransportMan
            (in_stack_fffffffffffffe10,
             (IO *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
             (Comm *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  transportman::TransportMan::TransportMan
            (in_stack_fffffffffffffe10,
             (IO *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
             (Comm *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  transportman::TransportMan::TransportMan
            (in_stack_fffffffffffffe10,
             (IO *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
             (Comm *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  *(undefined1 *)(in_RDI + 0xe9) = 0;
  *(undefined1 *)((long)in_RDI + 0x749) = 1;
  burstbuffer::FileDrainerSingleThread::FileDrainerSingleThread
            ((FileDrainerSingleThread *)
             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  message = (string *)(in_RDI + 0x10f);
  std::__cxx11::string::string((string *)message);
  activity = (string *)(in_RDI + 0x113);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xa2f7a4);
  source = (string *)(in_RDI + 0x116);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xa2f7bd);
  component = (string *)(in_RDI + 0x119);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xa2f7d6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xa2f7f2);
  priority = (int)in_RDI + 0x8f8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xa2f80e);
  verbosity = (int)in_RDI + 0x910;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xa2f82a);
  mode_00 = (char)in_RDI + 0x28;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xa2f846);
  *(undefined4 *)(in_RDI + 0x128) = 0;
  *(undefined1 *)((long)in_RDI + 0x944) = 0;
  if (BP4Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)::
      __var35 == '\0') {
    iVar1 = __cxa_guard_acquire(&BP4Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
                                 ::__var35);
    if (iVar1 != 0) {
      BP4Writer::__var35 = (void *)ps_timer_create_("BP4Writer::Open");
      in_stack_fffffffffffffe50 = BP4Writer::__var35;
      __cxa_guard_release(&BP4Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
                           ::__var35);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             (void *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"Verbose",&local_91);
  helper::GetParameter<int>(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,(int *)value);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Engine",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"BP4Writer",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffef8,"Open",(allocator *)&stack0xfffffffffffffef7);
  helper::Comm::Rank((Comm *)0xa2f9dd);
  uVar2 = *(undefined4 *)(in_RDI + 0x128);
  helper::Log(component,source,activity,message,(int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
              (int)in_stack_fffffffffffffe50,priority,verbosity,mode_00);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffef7);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  *(undefined1 *)(in_RDI[5] + 200) = 0;
  Init((BP4Writer *)CONCAT44(in_stack_fffffffffffffe04,uVar2));
  *(undefined1 *)(in_RDI + 0x10) = 1;
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer
            ((ScopedTimer *)CONCAT44(in_stack_fffffffffffffe04,uVar2));
  return;
}

Assistant:

BP4Writer::BP4Writer(IO &io, const std::string &name, const Mode mode, helper::Comm comm)
: Engine("BP4Writer", io, name, mode, std::move(comm)), m_BP4Serializer(m_Comm),
  m_FileDataManager(io, m_Comm), m_FileMetadataManager(io, m_Comm),
  m_FileMetadataIndexManager(io, m_Comm), m_FileDrainer()
{
    PERFSTUBS_SCOPED_TIMER("BP4Writer::Open");
    helper::GetParameter(m_IO.m_Parameters, "Verbose", m_Verbosity);
    helper::Log("Engine", "BP4Writer", "Open", m_Name, 0, m_Comm.Rank(), 5, m_Verbosity,
                helper::LogMode::INFO);

    m_IO.m_ReadStreaming = false;

    Init();

    m_IsOpen = true;
}